

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O2

int CBS_get_optional_asn1_uint64(CBS *cbs,uint64_t *out,CBS_ASN1_TAG tag,uint64_t default_value)

{
  int iVar1;
  int iVar2;
  int present;
  CBS child;
  
  iVar1 = CBS_get_optional_asn1(cbs,&child,&present,tag);
  iVar2 = 0;
  if (iVar1 != 0) {
    if (present == 0) {
      *out = default_value;
    }
    else {
      iVar1 = CBS_get_asn1_uint64(&child,out);
      if (iVar1 == 0) {
        return 0;
      }
      if (child.len != 0) {
        return 0;
      }
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int CBS_get_optional_asn1_uint64(CBS *cbs, uint64_t *out, CBS_ASN1_TAG tag,
                                 uint64_t default_value) {
  CBS child;
  int present;
  if (!CBS_get_optional_asn1(cbs, &child, &present, tag)) {
    return 0;
  }
  if (present) {
    if (!CBS_get_asn1_uint64(&child, out) || CBS_len(&child) != 0) {
      return 0;
    }
  } else {
    *out = default_value;
  }
  return 1;
}